

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O0

void __thiscall
QMimeGlobPatternList::match
          (QMimeGlobPatternList *this,QMimeGlobMatchResult *result,QString *fileName,
          AddMatchFilterFunc *filterFunc)

{
  QStringView pattern_00;
  bool bVar1;
  const_iterator o;
  QMimeGlobPattern *this_00;
  qsizetype qVar2;
  QString *mimeType;
  QStringView *in_RSI;
  long in_FS_OFFSET;
  qsizetype suffixLen;
  QMimeGlobPattern *glob;
  QMimeGlobPatternList *__range1;
  QString pattern;
  const_iterator __end1;
  const_iterator __begin1;
  QString *in_stack_ffffffffffffff28;
  function<bool_(const_QString_&)> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  QStringView *in_stack_ffffffffffffff40;
  QMimeGlobMatchResult *this_01;
  Data *local_38;
  char16_t *pcStack_30;
  QString *in_stack_ffffffffffffffd8;
  const_iterator this_02;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QMimeGlobPattern *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QMimeGlobPattern>::begin((QList<QMimeGlobPattern> *)in_stack_ffffffffffffff30);
  o = QList<QMimeGlobPattern>::end((QList<QMimeGlobPattern> *)in_stack_ffffffffffffff30);
  while (this_02 = o, bVar1 = QList<QMimeGlobPattern>::const_iterator::operator!=(&local_10,o),
        bVar1) {
    this_00 = QList<QMimeGlobPattern>::const_iterator::operator*(&local_10);
    bVar1 = QMimeGlobPattern::matchFileName(this_02.i,in_stack_ffffffffffffffd8);
    if (bVar1) {
      QMimeGlobPattern::mimeType(this_00);
      bVar1 = std::function<bool_(const_QString_&)>::operator()
                        (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      if (bVar1) {
        local_38 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        pcStack_30 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        in_stack_ffffffffffffffd8 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        QMimeGlobPattern::pattern(this_00);
        QString::QString((QString *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        QStringView::QStringView<QString,_true>
                  (in_stack_ffffffffffffff40,
                   (QString *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        pattern_00.m_data._0_4_ = in_stack_ffffffffffffff38;
        pattern_00.m_size = (qsizetype)in_stack_ffffffffffffff30;
        pattern_00.m_data._4_4_ = in_stack_ffffffffffffff3c;
        bVar1 = isSimplePattern(pattern_00);
        if (bVar1) {
          qVar2 = QString::size((QString *)&local_38);
          this_01 = (QMimeGlobMatchResult *)(qVar2 + -2);
        }
        else {
          this_01 = (QMimeGlobMatchResult *)0x0;
        }
        in_stack_ffffffffffffff40 = in_RSI;
        mimeType = QMimeGlobPattern::mimeType(this_00);
        in_stack_ffffffffffffff3c = QMimeGlobPattern::weight(this_00);
        QMimeGlobMatchResult::addMatch
                  (this_01,mimeType,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                   (QString *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (qsizetype)in_stack_ffffffffffffff30);
        QString::~QString((QString *)0x8ee734);
      }
    }
    QList<QMimeGlobPattern>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeGlobPatternList::match(QMimeGlobMatchResult &result, const QString &fileName,
                                 const AddMatchFilterFunc &filterFunc) const
{
    for (const QMimeGlobPattern &glob : *this) {
        if (glob.matchFileName(fileName) && filterFunc(glob.mimeType())) {
            const QString pattern = glob.pattern();
            const qsizetype suffixLen = isSimplePattern(pattern) ? pattern.size() - strlen("*.") : 0;
            result.addMatch(glob.mimeType(), glob.weight(), pattern, suffixLen);
        }
    }
}